

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdblob.cpp
# Opt level: O0

SQUserPointer sqstd_createblob(HSQUIRRELVM v,SQInteger size)

{
  SQRESULT SVar1;
  SQUserPointer pvVar2;
  SQBlob *local_30;
  SQBlob *blob;
  SQInteger top;
  SQInteger size_local;
  HSQUIRRELVM v_local;
  
  top = size;
  size_local = (SQInteger)v;
  blob = (SQBlob *)sq_gettop(v);
  sq_pushregistrytable((HSQUIRRELVM)size_local);
  sq_pushstring((HSQUIRRELVM)size_local,"std_blob",-1);
  SVar1 = sq_get((HSQUIRRELVM)size_local,-2);
  if (-1 < SVar1) {
    sq_remove((HSQUIRRELVM)size_local,-2);
    sq_push((HSQUIRRELVM)size_local,1);
    sq_pushinteger((HSQUIRRELVM)size_local,top);
    local_30 = (SQBlob *)0x0;
    SVar1 = sq_call((HSQUIRRELVM)size_local,2,1,0);
    if ((-1 < SVar1) &&
       (SVar1 = sq_getinstanceup((HSQUIRRELVM)size_local,-1,&local_30,&DAT_80000002), -1 < SVar1)) {
      sq_remove((HSQUIRRELVM)size_local,-2);
      pvVar2 = SQBlob::GetBuf(local_30);
      return pvVar2;
    }
  }
  sq_settop((HSQUIRRELVM)size_local,(SQInteger)blob);
  return (SQUserPointer)0x0;
}

Assistant:

SQUserPointer sqstd_createblob(HSQUIRRELVM v, SQInteger size)
{
    SQInteger top = sq_gettop(v);
    sq_pushregistrytable(v);
    sq_pushstring(v,_SC("std_blob"),-1);
    if(SQ_SUCCEEDED(sq_get(v,-2))) {
        sq_remove(v,-2); //removes the registry
        sq_push(v,1); // push the this
        sq_pushinteger(v,size); //size
        SQBlob *blob = NULL;
        if(SQ_SUCCEEDED(sq_call(v,2,SQTrue,SQFalse))
            && SQ_SUCCEEDED(sq_getinstanceup(v,-1,(SQUserPointer *)&blob,(SQUserPointer)SQSTD_BLOB_TYPE_TAG))) {
            sq_remove(v,-2);
            return blob->GetBuf();
        }
    }
    sq_settop(v,top);
    return NULL;
}